

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_power_word_fear(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_ESI;
  int in_EDI;
  int range;
  bool utter_fail;
  bool bad_fail;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  char *in_stack_000011b8;
  CHAR_DATA *in_stack_000011c0;
  CHAR_DATA *in_stack_00003748;
  CHAR_DATA *in_stack_00003750;
  undefined4 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  byte bVar3;
  byte bVar4;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  
  bVar4 = 0;
  bVar3 = 0;
  if (in_RCX == in_RDX) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
        (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
        (void *)(ulong)CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
        (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
        (void *)CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,
                                                       in_stack_ffffffffffffff68))),0);
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
        (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
        (void *)CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,
                                                       in_stack_ffffffffffffff68))),0);
    bVar1 = is_awake(in_RCX);
    if (bVar1) {
      bVar1 = is_affected(in_RCX,in_EDI);
      if (bVar1) {
        send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else {
        bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                            (CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffa4);
        if (bVar1) {
          act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
              (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              (void *)CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,
                                                             in_stack_ffffffffffffff68))),0);
          send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
        else {
          bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                              (CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              in_stack_ffffffffffffffa4);
          if (!bVar1) {
            bVar4 = 1;
            bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                                (CHAR_DATA *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                in_stack_ffffffffffffffa4);
            if (!bVar1) {
              bVar3 = 1;
            }
          }
          if ((bVar3 & 1) == 0) {
            act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                (void *)CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,
                                                               in_stack_ffffffffffffff68))),0);
            send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            iVar2 = in_ESI / 10;
            init_affect((AFFECT_DATA *)0x621107);
            number_range(in_stack_ffffffffffffff70,
                         CONCAT13(bVar4,CONCAT12(bVar3,in_stack_ffffffffffffff6c)));
            number_range(in_stack_ffffffffffffff70,
                         CONCAT13(bVar4,CONCAT12(bVar3,in_stack_ffffffffffffff6c)));
            affect_to_char((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (AFFECT_DATA *)
                           CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,iVar2)))
                          );
            number_range(in_stack_ffffffffffffff70,
                         CONCAT13(bVar4,CONCAT12(bVar3,in_stack_ffffffffffffff6c)));
            affect_to_char((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (AFFECT_DATA *)
                           CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,iVar2)))
                          );
            number_range(in_stack_ffffffffffffff70,
                         CONCAT13(bVar4,CONCAT12(bVar3,in_stack_ffffffffffffff6c)));
            affect_to_char((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (AFFECT_DATA *)
                           CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,iVar2)))
                          );
            number_range(in_stack_ffffffffffffff70,
                         CONCAT13(bVar4,CONCAT12(bVar3,in_stack_ffffffffffffff6c)));
            affect_to_char((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (AFFECT_DATA *)
                           CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,iVar2)))
                          );
            number_range(in_stack_ffffffffffffff70,
                         CONCAT13(bVar4,CONCAT12(bVar3,in_stack_ffffffffffffff6c)));
            affect_to_char((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (AFFECT_DATA *)
                           CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,iVar2)))
                          );
            if (in_RCX->position == 7) {
              do_flee(in_stack_000011c0,in_stack_000011b8);
            }
            if (in_RCX->position == 7) {
              do_flee(in_stack_000011c0,in_stack_000011b8);
            }
            if (in_RCX->position == 7) {
              do_flee(in_stack_000011c0,in_stack_000011b8);
            }
            if ((bVar4 & 1) != 0) {
              LAG_CHAR((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       CONCAT13(bVar4,CONCAT12(bVar3,in_stack_ffffffffffffff6c)));
            }
          }
          else {
            act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                (void *)CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,
                                                               in_stack_ffffffffffffff68))),0);
            send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            raw_kill(in_stack_00003750,in_stack_00003748);
          }
        }
      }
    }
    else {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
          (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (void *)CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,
                                                         in_stack_ffffffffffffff68))),0);
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

void spell_power_word_fear(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	bool bad_fail, utter_fail;
	int range;

	bad_fail = false;
	utter_fail = false;

	if (victim == ch)
	{
		send_to_char("That wouldn't work.\n\r", ch);
		return;
	}

	act("$n points at $N and utters the word 'Fear!'", ch, 0, victim, TO_NOTVICT);
	act("$n points at you and utters the word 'Fear!'", ch, 0, victim, TO_VICT);
	act("You point at $N and utter the word 'Fear!'", ch, 0, victim, TO_CHAR);

	if (!is_awake(victim))
	{
		act("$n shivers momentarily but it passes.", victim, 0, 0, TO_ROOM);
		send_to_char("You feel a brief terror, but it passes away in your dreams.\n\r", victim);
		return;
	}

	if (is_affected(victim, sn))
	{
		send_to_char("They are already affected by a word of power.\n\r", ch);
		send_to_char("You feel a shiver pass through you but it has no further affect.\n\r", victim);
		return;
	}

	if (saves_spell(level, victim, DAM_OTHER))
	{
		act("$n shivers momentarily but it passes.", victim, 0, 0, TO_ROOM);
		send_to_char("You feel a brief terror, but it passes.\n\r", victim);
		return;
	}

	if (!saves_spell(level - 2, victim, DAM_OTHER))
	{
		bad_fail = true;

		if (!saves_spell(level - 5, victim, DAM_OTHER))
			utter_fail = true;
	}

	if (utter_fail)
	{
		act("$n's eyes widen and $s heart ruptures from shock!", victim, 0, 0, TO_ROOM);
		send_to_char("You feel a terror so intense your heart stops dead!\n\r", victim);
		raw_kill(ch, victim);
		return;
	}

	act("$n's eyes widen in shock and $s entire body freezes in momentary terror.", victim, nullptr, nullptr, TO_ROOM);
	send_to_char("You feel an overwhelming terror and you shudder in momentary shock.\n\r", victim);

	range = level / 10;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = (number_range(1, 5) + range);
	af.location = APPLY_CON;
	af.modifier = -number_range(2, range + 1);
	affect_to_char(victim, &af);

	af.location = APPLY_STR;
	af.modifier = -number_range(2, range + 1);
	affect_to_char(victim, &af);

	af.location = APPLY_DEX;
	af.modifier = -number_range(1, range);
	affect_to_char(victim, &af);

	af.location = APPLY_HIT;
	af.modifier = -number_range(2, range);
	affect_to_char(victim, &af);

	af.location = APPLY_DAMROLL;
	af.modifier = -number_range(2, range);
	affect_to_char(victim, &af);

	if (victim->position == POS_FIGHTING)
		do_flee(victim, "");

	if (victim->position == POS_FIGHTING)
		do_flee(victim, "");

	if (victim->position == POS_FIGHTING)
		do_flee(victim, "");

	if (bad_fail)
		LAG_CHAR(victim, 12);
}